

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManPrintCone(Gia_Man_t *p,Gia_Obj_t *pObj,int *pLeaves,int nLeaves,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  
  vNodes->nSize = 0;
  if (0 < nLeaves) {
    uVar3 = 0;
    do {
      Vec_IntPush(vNodes,pLeaves[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)nLeaves != uVar3);
  }
  Gia_ManPrintCollect_rec(p,pObj,vNodes);
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    printf("GIA logic cone for node %d:\n",
           (ulong)(uint)((int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555));
    if (0 < vNodes->nSize) {
      lVar4 = 0;
      do {
        iVar1 = vNodes->pArray[lVar4];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        Gia_ObjPrint(p,p->pObjs + iVar1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vNodes->nSize);
    }
    return;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManPrintCone( Gia_Man_t * p, Gia_Obj_t * pObj, int * pLeaves, int nLeaves, Vec_Int_t * vNodes )
{
    int i;
    Vec_IntClear( vNodes );
    for ( i = 0; i < nLeaves; i++ )
        Vec_IntPush( vNodes, pLeaves[i] );
    Gia_ManPrintCollect_rec( p, pObj, vNodes );
    printf( "GIA logic cone for node %d:\n", Gia_ObjId(p, pObj) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ObjPrint( p, pObj );
}